

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateLoop<unsigned_int>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sel_t sVar4;
  void *__dest_00;
  long lVar5;
  long lVar6;
  anon_class_40_5_fa23cdf1 *count_00;
  ulong uVar7;
  idx_t i;
  ulong uVar8;
  size_t sVar9;
  uint *puVar10;
  long lVar11;
  idx_t id;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  UpdateInfo *pUVar17;
  sel_t result_ids [2048];
  uint result_values [2048];
  idx_t local_40c0;
  UpdateInfo *local_40b8;
  idx_t local_40b0;
  void *local_40a8;
  UpdateInfo *local_40a0;
  long local_4098;
  UpdateInfo *local_4090;
  SelectionVector *local_4088;
  data_ptr_t local_4080;
  sel_t *local_4078;
  long local_4070;
  uint *local_4068;
  anon_class_40_5_fa23cdf1 local_4060;
  sel_t local_4038 [2048];
  uint local_2038 [2050];
  
  local_4080 = base_data->data;
  local_4088 = update->sel;
  local_4068 = (uint *)update->data;
  lVar6 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_4070 = (ulong)base_info->max << 2;
  local_40a0 = update_info + 1;
  local_40a8 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_4098 = (ulong)update_info->max * 4;
  local_4078 = sel->sel_vector;
  uVar1 = update_info->N;
  uVar15 = (ulong)base_info->N;
  lVar5 = 0;
  uVar8 = 0;
  uVar16 = 0;
  uVar13 = 0;
  while( true ) {
    if (uVar8 == count) break;
    uVar7 = uVar8;
    if (local_4078 != (sel_t *)0x0) {
      uVar7 = (ulong)local_4078[uVar8];
    }
    uVar7 = ids[uVar7] - lVar6;
    for (lVar11 = 0; lVar11 + uVar16 < (ulong)uVar1; lVar11 = lVar11 + 1) {
      uVar2 = *(uint *)((long)&local_40a0->segment + lVar11 * 4 + uVar16 * 4);
      if (uVar7 <= uVar2) {
        if (uVar7 == uVar2) {
          local_2038[lVar5 + lVar11] = *(uint *)((long)local_40a8 + lVar11 * 4 + uVar16 * 4);
          local_4038[lVar5 + lVar11] = uVar2;
          uVar14 = uVar13;
          uVar16 = lVar11 + uVar16 + 1;
          goto LAB_0053b103;
        }
        break;
      }
      local_2038[lVar5 + lVar11] = *(uint *)((long)local_40a8 + lVar11 * 4 + uVar16 * 4);
      local_4038[lVar5 + lVar11] = uVar2;
    }
    uVar14 = uVar15;
    if (uVar15 < uVar13) {
      uVar14 = uVar13;
    }
    puVar10 = (uint *)((long)__dest_00 + uVar13 * 4);
    for (; uVar13 < uVar15; uVar13 = uVar13 + 1) {
      uVar12 = (ulong)*(uint *)((long)&__dest->segment + uVar13 * 4);
      if (uVar7 <= uVar12) {
        uVar14 = uVar13;
        if (uVar7 == uVar12) goto LAB_0053b0f7;
        break;
      }
      puVar10 = puVar10 + 1;
    }
    puVar10 = (uint *)(local_4080 + uVar7 * 4);
LAB_0053b0f7:
    local_2038[lVar5 + lVar11] = *puVar10;
    local_4038[lVar5 + lVar11] = (sel_t)uVar7;
    uVar16 = lVar11 + uVar16;
LAB_0053b103:
    lVar5 = lVar5 + lVar11 + 1;
    uVar8 = uVar8 + 1;
    uVar13 = uVar14;
  }
  sVar9 = lVar5 * 4;
  for (lVar11 = 0; lVar11 + uVar16 < (ulong)uVar1; lVar11 = lVar11 + 1) {
    local_2038[lVar5 + lVar11] =
         *(uint *)((long)&update_info[1].segment + lVar11 * 4 + local_4098 + uVar16 * 4);
    local_4038[lVar5 + lVar11] = *(sel_t *)((long)&update_info[1].segment + lVar11 * 4 + uVar16 * 4)
    ;
    sVar9 = sVar9 + 4;
  }
  update_info->N = (int)lVar5 + (int)lVar11;
  local_40b8 = base_info;
  local_40b0 = count;
  local_4090 = update_info;
  switchD_00916250::default(local_40a8,(uint (*) [2048])local_2038,sVar9);
  switchD_00916250::default(local_40a0,&local_4038,sVar9);
  local_4060.result_offset = &local_40c0;
  local_40c0 = 0;
  count_00 = &local_4060;
  local_4060.update_vector_data = &local_4068;
  local_4060.update_vector_sel = local_4088;
  uVar1 = local_40b8->N;
  uVar13 = 0;
  uVar16 = 0;
  pUVar17 = __dest;
  local_4060.result_values = (uint (*) [2048])local_2038;
  local_4060.result_ids = &local_4038;
  do {
    while( true ) {
      if ((count <= uVar16) || (uVar1 <= uVar13)) {
        for (; uVar16 < count; uVar16 = uVar16 + 1) {
          uVar8 = uVar16;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)sel->sel_vector[uVar16];
          }
          MergeUpdateLoopInternal<unsigned_int,_unsigned_int,_duckdb::ExtractStandardEntry>::
          anon_class_40_5_fa23cdf1::operator()(&local_4060,ids[uVar8] - lVar6,uVar8,(idx_t)count_00)
          ;
        }
        sVar9 = local_40c0 * 4;
        for (lVar5 = 0; lVar5 + uVar13 < (ulong)uVar1; lVar5 = lVar5 + 1) {
          sVar4 = *(sel_t *)&pUVar17->segment;
          local_2038[local_40c0 + lVar5] = *(uint *)((long)&pUVar17->segment + local_4070);
          local_4038[local_40c0 + lVar5] = sVar4;
          sVar9 = sVar9 + 4;
          pUVar17 = (UpdateInfo *)((long)&pUVar17->segment + 4);
        }
        local_40b8->N = (int)local_40c0 + (int)lVar5;
        switchD_00916250::default(__dest_00,local_2038,sVar9);
        switchD_00916250::default(__dest,local_4038,sVar9);
        return;
      }
      uVar8 = uVar16;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel->sel_vector[uVar16];
      }
      id = ids[uVar8] - lVar6;
      uVar2 = *(uint *)((long)&__dest->segment + uVar13 * 4);
      if (id != uVar2) break;
      MergeUpdateLoopInternal<unsigned_int,_unsigned_int,_duckdb::ExtractStandardEntry>::
      anon_class_40_5_fa23cdf1::operator()(&local_4060,id,uVar8,(idx_t)count_00);
      uVar16 = uVar16 + 1;
LAB_0053b25b:
      uVar13 = uVar13 + 1;
      pUVar17 = (UpdateInfo *)((long)&pUVar17->segment + 4);
    }
    if (uVar2 <= id) {
      uVar3 = *(uint *)((long)__dest_00 + uVar13 * 4);
      count_00 = (anon_class_40_5_fa23cdf1 *)(ulong)uVar3;
      local_2038[local_40c0] = uVar3;
      local_4038[local_40c0] = uVar2;
      local_40c0 = local_40c0 + 1;
      goto LAB_0053b25b;
    }
    MergeUpdateLoopInternal<unsigned_int,_unsigned_int,_duckdb::ExtractStandardEntry>::
    anon_class_40_5_fa23cdf1::operator()(&local_4060,id,uVar8,(idx_t)count_00);
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}